

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options)

{
  int iVar1;
  pointer ppMVar2;
  ulong uVar3;
  long *plVar4;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar5;
  MessageGenerator *pMVar6;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar7;
  EnumGenerator *this_00;
  scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *psVar8;
  ServiceGenerator *this_01;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *psVar9;
  ExtensionGenerator *this_02;
  int i;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  this->file_ = file;
  Options::Options(&this->options_,options);
  SCCAnalyzer::SCCAnalyzer(&this->scc_analyzer_,options);
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->service_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = *(int *)(file + 0x58);
  lVar11 = (long)iVar1;
  uVar10 = lVar11 * 8;
  uVar3 = 0xffffffffffffffff;
  uVar12 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar12 = uVar3;
  }
  if (lVar11 < 0) {
    uVar12 = uVar3;
  }
  plVar4 = (long *)operator_new__(uVar12);
  *plVar4 = lVar11;
  if (iVar1 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *)(plVar4 + 1),0,uVar10);
  }
  (this->message_generators_owner_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *)(plVar4 + 1);
  iVar1 = *(int *)(file + 0x68);
  lVar11 = (long)iVar1;
  uVar10 = lVar11 * 8;
  uVar12 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar12 = uVar3;
  }
  if (lVar11 < 0) {
    uVar12 = uVar3;
  }
  plVar4 = (long *)operator_new__(uVar12);
  *plVar4 = lVar11;
  if (iVar1 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *)(plVar4 + 1),0,uVar10);
  }
  (this->enum_generators_owner_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *)(plVar4 + 1);
  iVar1 = *(int *)(file + 0x78);
  lVar11 = (long)iVar1;
  uVar10 = lVar11 * 8;
  uVar12 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar12 = uVar3;
  }
  if (lVar11 < 0) {
    uVar12 = uVar3;
  }
  plVar4 = (long *)operator_new__(uVar12);
  *plVar4 = lVar11;
  if (iVar1 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *)(plVar4 + 1),0,uVar10);
  }
  (this->service_generators_owner_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *)(plVar4 + 1);
  iVar1 = *(int *)(file + 0x88);
  lVar11 = (long)iVar1;
  uVar10 = lVar11 * 8;
  uVar12 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar12 = uVar3;
  }
  if (lVar11 < 0) {
    uVar12 = uVar3;
  }
  plVar4 = (long *)operator_new__(uVar12);
  *plVar4 = lVar11;
  if (iVar1 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *)(plVar4 + 1),0,uVar10)
    ;
  }
  (this->extension_generators_owner_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *)(plVar4 + 1);
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->package_parts_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar11 = 0;
  for (lVar13 = 0; lVar13 < *(int *)(file + 0x58); lVar13 = lVar13 + 1) {
    psVar5 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::operator[](&this->message_generators_owner_,lVar13);
    pMVar6 = (MessageGenerator *)operator_new(0x118);
    MessageGenerator::MessageGenerator
              (pMVar6,(Descriptor *)(*(long *)(file + 0x60) + lVar11),options,&this->scc_analyzer_);
    internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::reset(psVar5,pMVar6);
    psVar5 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::operator[](&this->message_generators_owner_,lVar13);
    pMVar6 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                       (psVar5);
    MessageGenerator::Flatten(pMVar6,&this->message_generators_);
    lVar11 = lVar11 + 0xa8;
  }
  for (uVar10 = 0;
      ppMVar2 = (this->message_generators_).
                super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->message_generators_).
                             super__Vector_base<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2 >> 3);
      uVar10 = uVar10 + 1) {
    MessageGenerator::AddGenerators
              (ppMVar2[uVar10],&this->enum_generators_,&this->extension_generators_);
  }
  lVar13 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(file + 0x68); lVar11 = lVar11 + 1) {
    psVar7 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
             ::operator[](&this->enum_generators_owner_,lVar11);
    this_00 = (EnumGenerator *)operator_new(0x38);
    EnumGenerator::EnumGenerator
              (this_00,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar13),options);
    internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::reset(psVar7,this_00);
    psVar7 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
             ::operator[](&this->enum_generators_owner_,lVar11);
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar7->ptr_;
    std::
    vector<google::protobuf::compiler::cpp::EnumGenerator*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator*>>
    ::emplace_back<google::protobuf::compiler::cpp::EnumGenerator*>
              ((vector<google::protobuf::compiler::cpp::EnumGenerator*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator*>>
                *)&this->enum_generators_,(EnumGenerator **)&local_48);
    lVar13 = lVar13 + 0x38;
  }
  lVar13 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(file + 0x78); lVar11 = lVar11 + 1) {
    psVar8 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
             ::operator[](&this->service_generators_owner_,lVar11);
    this_01 = (ServiceGenerator *)operator_new(0x40);
    ServiceGenerator::ServiceGenerator
              (this_01,(ServiceDescriptor *)(*(long *)(file + 0x80) + lVar13),options);
    internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>::reset(psVar8,this_01);
    psVar8 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
             ::operator[](&this->service_generators_owner_,lVar11);
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar8->ptr_;
    std::
    vector<google::protobuf::compiler::cpp::ServiceGenerator*,std::allocator<google::protobuf::compiler::cpp::ServiceGenerator*>>
    ::emplace_back<google::protobuf::compiler::cpp::ServiceGenerator*>
              ((vector<google::protobuf::compiler::cpp::ServiceGenerator*,std::allocator<google::protobuf::compiler::cpp::ServiceGenerator*>>
                *)&this->service_generators_,(ServiceGenerator **)&local_48);
    lVar13 = lVar13 + 0x30;
  }
  lVar13 = 0;
  for (lVar11 = 0; lVar11 < *(int *)(file + 0x88); lVar11 = lVar11 + 1) {
    psVar9 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
             ::operator[](&this->extension_generators_owner_,lVar11);
    this_02 = (ExtensionGenerator *)operator_new(0x90);
    ExtensionGenerator::ExtensionGenerator
              (this_02,(FieldDescriptor *)(*(long *)(file + 0x98) + lVar13),options);
    internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::reset(psVar9,this_02)
    ;
    psVar9 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
             ::operator[](&this->extension_generators_owner_,lVar11);
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar9->ptr_;
    std::
    vector<google::protobuf::compiler::cpp::ExtensionGenerator*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator*>>
    ::emplace_back<google::protobuf::compiler::cpp::ExtensionGenerator*>
              ((vector<google::protobuf::compiler::cpp::ExtensionGenerator*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator*>>
                *)&this->extension_generators_,(ExtensionGenerator **)&local_48);
    lVar13 = lVar13 + 0xa8;
  }
  Split(&local_48,*(string **)(this->file_ + 8),".",true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->package_parts_,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options)
    : file_(file),
      options_(options),
      scc_analyzer_(options),
      message_generators_owner_(
          new google::protobuf::scoped_ptr<MessageGenerator>[file->message_type_count()]),
      enum_generators_owner_(
          new google::protobuf::scoped_ptr<EnumGenerator>[file->enum_type_count()]),
      service_generators_owner_(
          new google::protobuf::scoped_ptr<ServiceGenerator>[file->service_count()]),
      extension_generators_owner_(
          new google::protobuf::scoped_ptr<ExtensionGenerator>[file->extension_count()]) {

  for (int i = 0; i < file->message_type_count(); i++) {
    message_generators_owner_[i].reset(
        new MessageGenerator(file->message_type(i), options, &scc_analyzer_));
    message_generators_owner_[i]->Flatten(&message_generators_);
  }

  for (int i = 0; i < message_generators_.size(); i++) {
    message_generators_[i]->AddGenerators(&enum_generators_,
                                          &extension_generators_);
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    enum_generators_owner_[i].reset(
        new EnumGenerator(file->enum_type(i), options));
    enum_generators_.push_back(enum_generators_owner_[i].get());
  }

  for (int i = 0; i < file->service_count(); i++) {
    service_generators_owner_[i].reset(
        new ServiceGenerator(file->service(i), options));
    service_generators_.push_back(service_generators_owner_[i].get());
  }

  for (int i = 0; i < file->extension_count(); i++) {
    extension_generators_owner_[i].reset(
        new ExtensionGenerator(file->extension(i), options));
    extension_generators_.push_back(extension_generators_owner_[i].get());
  }

  package_parts_ = Split(file_->package(), ".", true);
}